

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,NumeralExpression *expression)

{
  VariableValue *this_00;
  PrimitiveSimpleObject *this_01;
  Type *this_02;
  allocator<char> local_49;
  string local_48;
  NumeralExpression *local_18;
  NumeralExpression *expression_local;
  NewFunctionProcessingVisitor *this_local;
  
  local_18 = expression;
  expression_local = (NumeralExpression *)this;
  this_00 = (VariableValue *)operator_new(0x50);
  this_01 = (PrimitiveSimpleObject *)operator_new(0x18);
  this_02 = (Type *)operator_new(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"int",&local_49);
  Type::Type(this_02,&local_48);
  PrimitiveSimpleObject::PrimitiveSimpleObject(this_01,this_02);
  VariableValue::VariableValue(this_00,this_01,local_18->value_);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)this_00;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(NumeralExpression* expression) {
  tos_value_ = new VariableValue(new PrimitiveSimpleObject(new Type("int")),
                                 expression->value_);
}